

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_2_5::convertInPlace(char **writePtr,char **readPtr,PixelType type,size_t numPixels)

{
  ArgExc *this;
  ulong in_RCX;
  int in_EDX;
  long *in_RSI;
  bytesOrFloat tmp;
  size_t j_2;
  size_t j_1;
  size_t j;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  char **in_stack_ffffffffffffffb0;
  ulong local_40;
  ulong local_30;
  ulong local_28;
  
  if (in_EDX == 0) {
    for (local_28 = 0; local_28 < in_RCX; local_28 = local_28 + 1) {
      Xdr::write<Imf_2_5::CharPtrIO,char*>
                (in_stack_ffffffffffffffb0,(uint)in_stack_ffffffffffffffac);
      *in_RSI = *in_RSI + 4;
    }
  }
  else if (in_EDX == 1) {
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      Xdr::write<Imf_2_5::CharPtrIO,char*>
                ((char **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (half)(unsigned_short)((ulong)in_stack_ffffffffffffffb0 >> 0x30));
      *in_RSI = *in_RSI + 2;
    }
  }
  else {
    if (in_EDX != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this,"Unknown pixel data type.");
      __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      Xdr::write<Imf_2_5::CharPtrIO,char*>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      *in_RSI = *in_RSI + 4;
    }
  }
  return;
}

Assistant:

void
convertInPlace (char *& writePtr,
                const char *& readPtr,
		PixelType type,
                size_t numPixels)
{
    switch (type)
    {
      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
    
        for (size_t j = 0; j < numPixels; ++j)
        {
            Xdr::write <CharPtrIO> (writePtr, *(const unsigned int *) readPtr);
            readPtr += sizeof(unsigned int);
        }
        break;
    
      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
    
        for (size_t j = 0; j < numPixels; ++j)
        {               
            Xdr::write <CharPtrIO> (writePtr, *(const half *) readPtr);
            readPtr += sizeof(half);
        }
        break;
    
      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
    
        for (size_t j = 0; j < numPixels; ++j)
        {
            union bytesOrFloat tmp;
            tmp.b = * reinterpret_cast<const FBytes *>( readPtr );
            Xdr::write <CharPtrIO> (writePtr, tmp.f);
            readPtr += sizeof(float);
        }
        break;
    
      default:
    
        throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
    }
}